

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QTableView::scrollContentsBy(QTableView *this,int dx,int dy)

{
  QAbstractItemViewPrivate *this_00;
  QHeaderViewPrivate *pQVar1;
  QWidget *pQVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  int iVar5;
  ScrollMode SVar6;
  int iVar7;
  QScrollBar *pQVar8;
  int dx_00;
  
  this_00 = *(QAbstractItemViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  QBasicTimer::stop();
  bVar4 = QWidget::isRightToLeft((QWidget *)this);
  dx_00 = 0;
  if (dx != 0) {
    dx_00 = -dx;
    if (!bVar4) {
      dx_00 = dx;
    }
    iVar5 = QHeaderView::offset(*(QHeaderView **)
                                 &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                  super_QWidgetPrivate.field_0x40);
    pQVar1 = *(QHeaderViewPrivate **)
              (*(long *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                         super_QWidgetPrivate.field_0x40 + 8);
    pQVar8 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
    SVar6 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    QHeaderViewPrivate::setScrollOffset(pQVar1,pQVar8,SVar6);
    SVar6 = QAbstractItemView::horizontalScrollMode((QAbstractItemView *)this);
    if (SVar6 == ScrollPerItem) {
      iVar7 = QHeaderView::offset(*(QHeaderView **)
                                   &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                    super_QWidgetPrivate.field_0x40);
      bVar4 = QWidget::isRightToLeft((QWidget *)this);
      dx_00 = iVar5 - iVar7;
      if (bVar4) {
        dx_00 = iVar7 - iVar5;
      }
    }
  }
  iVar5 = 0;
  if (dy != 0) {
    iVar7 = QHeaderView::offset(*(QHeaderView **)
                                 &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                  super_QWidgetPrivate.field_0x48);
    pQVar1 = *(QHeaderViewPrivate **)
              (*(long *)&this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                         super_QWidgetPrivate.field_0x48 + 8);
    pQVar8 = QAbstractScrollArea::verticalScrollBar((QAbstractScrollArea *)this);
    SVar6 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
    QHeaderViewPrivate::setScrollOffset(pQVar1,pQVar8,SVar6);
    SVar6 = QAbstractItemView::verticalScrollMode((QAbstractItemView *)this);
    iVar5 = dy;
    if (SVar6 == ScrollPerItem) {
      iVar5 = QHeaderView::offset(*(QHeaderView **)
                                   &this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                    super_QWidgetPrivate.field_0x48);
      iVar5 = iVar7 - iVar5;
    }
  }
  QAbstractItemViewPrivate::scrollContentsBy(this_00,dx_00,iVar5);
  if (this_00[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.
      super_QObjectPrivate == (QObjectPrivate)0x1) {
    if ((0 < iVar5) &&
       ((*(byte *)(*(long *)(*(long *)&this_00[1].super_QAbstractScrollAreaPrivate.
                                       super_QFramePrivate.super_QWidgetPrivate.field_0x40 + 0x20) +
                  10) & 1) != 0)) {
      pQVar2 = (this_00->super_QAbstractScrollAreaPrivate).viewport;
      pQVar3 = pQVar2->data;
      QWidget::update(pQVar2,0,iVar5,((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1,iVar5);
    }
    if ((0 < dx_00) &&
       ((*(byte *)(*(long *)(*(long *)&this_00[1].super_QAbstractScrollAreaPrivate.
                                       super_QFramePrivate.super_QWidgetPrivate.field_0x48 + 0x20) +
                  10) & 1) != 0)) {
      pQVar2 = (this_00->super_QAbstractScrollAreaPrivate).viewport;
      pQVar3 = pQVar2->data;
      QWidget::update(pQVar2,dx_00,0,dx_00,((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1);
      return;
    }
  }
  return;
}

Assistant:

void QTableView::scrollContentsBy(int dx, int dy)
{
    Q_D(QTableView);

    d->delayedAutoScroll.stop(); // auto scroll was canceled by the user scrolling

    dx = isRightToLeft() ? -dx : dx;
    if (dx) {
        int oldOffset = d->horizontalHeader->offset();
        d->horizontalHeader->d_func()->setScrollOffset(horizontalScrollBar(), horizontalScrollMode());
        if (horizontalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->horizontalHeader->offset();
            dx = isRightToLeft() ? newOffset - oldOffset : oldOffset - newOffset;
        }
    }
    if (dy) {
        int oldOffset = d->verticalHeader->offset();
        d->verticalHeader->d_func()->setScrollOffset(verticalScrollBar(), verticalScrollMode());
        if (verticalScrollMode() == QAbstractItemView::ScrollPerItem) {
            int newOffset = d->verticalHeader->offset();
            dy = oldOffset - newOffset;
        }
    }
    d->scrollContentsBy(dx, dy);

    if (d->showGrid) {
        //we need to update the first line of the previous top item in the view
        //because it has the grid drawn if the header is invisible.
        //It is strictly related to what's done at then end of the paintEvent
        if (dy > 0 && d->horizontalHeader->isHidden()) {
            d->viewport->update(0, dy, d->viewport->width(), dy);
        }
        if (dx > 0 && d->verticalHeader->isHidden()) {
            d->viewport->update(dx, 0, dx, d->viewport->height());
        }
    }
}